

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptFunction * __thiscall
Js::JavascriptLibrary::CreateNonProfiledFunction(JavascriptLibrary *this,FunctionInfo *functionInfo)

{
  code *pcVar1;
  bool bVar2;
  Attributes AVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  RuntimeFunction *this_00;
  JavascriptMethod entryPoint;
  DynamicType *type;
  TrackAllocData local_40;
  FunctionInfo *local_18;
  FunctionInfo *functionInfo_local;
  JavascriptLibrary *this_local;
  
  local_18 = functionInfo;
  functionInfo_local = (FunctionInfo *)this;
  AVar3 = FunctionInfo::GetAttributes(functionInfo);
  if ((AVar3 & DoNotProfile) == None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x18da,
                                "(functionInfo->GetAttributes() & FunctionInfo::DoNotProfile)",
                                "functionInfo->GetAttributes() & FunctionInfo::DoNotProfile");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&RuntimeFunction::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x18dd);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_40);
  this_00 = (RuntimeFunction *)new<Memory::Recycler>(0x40,pRVar5,0x43c4b0);
  entryPoint = FunctionInfo::GetOriginalEntryPoint(local_18);
  type = CreateDeferredPrototypeFunctionTypeNoProfileThunk(this,entryPoint,false);
  RuntimeFunction::RuntimeFunction(this_00,type,local_18);
  return &this_00->super_JavascriptFunction;
}

Assistant:

JavascriptFunction* JavascriptLibrary::CreateNonProfiledFunction(FunctionInfo * functionInfo)
    {
        Assert(functionInfo->GetAttributes() & FunctionInfo::DoNotProfile);
        return RecyclerNew(this->GetRecycler(), RuntimeFunction,
            CreateDeferredPrototypeFunctionTypeNoProfileThunk(functionInfo->GetOriginalEntryPoint()),
            functionInfo);
    }